

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementSlot
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot fieldRegSlot,RegSlot regSlot,
          int32 slotId,ProfileId profileId)

{
  code *pcVar1;
  SymOpnd *dstOpnd;
  int32 reg;
  OpCode OVar2;
  bool bVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  FunctionInfoPtrPtr address;
  AddrOpnd *src1Opnd_00;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  IntConstOpnd *pIVar9;
  RegOpnd *pRVar10;
  Opnd *pOVar11;
  Opnd *firstArg;
  IntConstOpnd *valOpnd;
  IntConstType value;
  RegOpnd *src1Opnd;
  RegOpnd *src0Opnd;
  Opnd *homeObjOpnd;
  Opnd *environmentOpnd_1;
  AddrOpnd *functionBodySlotOpnd_1;
  FunctionInfoPtrPtr infoRef;
  RegOpnd *dataOpnd;
  Opnd *environmentOpnd;
  Opnd *functionBodySlotOpnd;
  StackSym *pSStack_58;
  bool isLdSlotThatWasNotProfiled;
  StackSym *stackFuncPtrSym;
  PropertySym *fieldSym;
  SymOpnd *pSStack_40;
  PropertyKind propertyKind;
  SymOpnd *fieldSymOpnd;
  RegOpnd *regOpnd;
  Instr *instr;
  RegSlot local_20;
  int32 slotId_local;
  RegSlot regSlot_local;
  RegSlot fieldRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  instr._4_4_ = slotId;
  local_20 = regSlot;
  slotId_local = fieldRegSlot;
  regSlot_local = offset;
  fieldRegSlot_local._2_2_ = newOpcode;
  _offset_local = this;
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xd74,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  fieldSym._7_1_ = PropertyKindSlots;
  pSStack_58 = (StackSym *)0x0;
  functionBodySlotOpnd._7_1_ = 0;
  if (fieldRegSlot_local._2_2_ == LdSlot) {
LAB_006484ed:
    pSStack_40 = BuildFieldOpnd(this,fieldRegSlot_local._2_2_,slotId_local,instr._4_4_,0xffffffff,
                                fieldSym._7_1_,0xffffffff);
LAB_0064851c:
    fieldSymOpnd = (SymOpnd *)BuildDstOpnd(this,local_20,TyVar,false,false);
    regOpnd = (RegOpnd *)0x0;
    if (profileId != 0xffff) {
      regOpnd = (RegOpnd *)
                BuildProfiledSlotLoad
                          (this,fieldRegSlot_local._2_2_,(RegOpnd *)fieldSymOpnd,pSStack_40,
                           profileId,(bool *)((long)&functionBodySlotOpnd + 7));
    }
    if (regOpnd == (RegOpnd *)0x0) {
      regOpnd = (RegOpnd *)
                IR::Instr::New(fieldRegSlot_local._2_2_,&fieldSymOpnd->super_Opnd,
                               &pSStack_40->super_Opnd,this->m_func);
    }
  }
  else {
    if (fieldRegSlot_local._2_2_ == NewScFuncHomeObj) {
LAB_00648173:
      this_00 = Func::GetJITFunctionBody(this->m_func);
      address = JITTimeFunctionBody::GetNestedFuncRef(this_00,instr._4_4_);
      src1Opnd_00 = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
      pOVar11 = GetEnvironmentOperand(this,regSlot_local);
      pRVar7 = BuildSrcOpnd(this,slotId_local,TyVar);
      fieldSymOpnd = (SymOpnd *)BuildDstOpnd(this,local_20,TyVar,false,false);
      pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
      regOpnd = (RegOpnd *)
                IR::Instr::New(ExtendArg_A,&pRVar8->super_Opnd,&pRVar7->super_Opnd,this->m_func);
      AddInstr(this,(Instr *)regOpnd,regSlot_local);
      pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
      pOVar6 = IR::Instr::GetDst((Instr *)regOpnd);
      regOpnd = (RegOpnd *)
                IR::Instr::New(ExtendArg_A,&pRVar7->super_Opnd,&src1Opnd_00->super_Opnd,pOVar6,
                               this->m_func);
      AddInstr(this,(Instr *)regOpnd,regSlot_local);
      pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
      pOVar6 = IR::Instr::GetDst((Instr *)regOpnd);
      regOpnd = (RegOpnd *)
                IR::Instr::New(ExtendArg_A,&pRVar7->super_Opnd,pOVar11,pOVar6,this->m_func);
      AddInstr(this,(Instr *)regOpnd,regSlot_local);
      OVar2 = fieldRegSlot_local._2_2_;
      dstOpnd = fieldSymOpnd;
      pOVar11 = IR::Instr::GetDst((Instr *)regOpnd);
      regOpnd = (RegOpnd *)IR::Instr::New(OVar2,&dstOpnd->super_Opnd,pOVar11,this->m_func);
      if (((ulong)fieldSymOpnd->m_sym[1]._vptr_Sym & 1) != 0) {
        *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym =
             *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym & 0xfffffffb | 4;
        *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym =
             *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym & 0xfffffffd | 2;
      }
      AddInstr(this,(Instr *)regOpnd,regSlot_local);
      return;
    }
    if (fieldRegSlot_local._2_2_ == LdObjSlot) {
      fieldRegSlot_local._2_2_ = LdSlot;
LAB_006483e2:
      fieldSymOpnd = (SymOpnd *)IR::RegOpnd::New(TyVar,this->m_func);
      OVar2 = fieldRegSlot_local._2_2_;
      reg = slotId_local;
      DVar4 = Js::DynamicObject::GetOffsetOfAuxSlots();
      pSStack_40 = BuildFieldOpnd(this,OVar2,reg,DVar4 >> 3,0xffffffff,PropertyKindSlotArray,
                                  0xffffffff);
      regOpnd = (RegOpnd *)
                IR::Instr::New(LdSlotArr,&fieldSymOpnd->super_Opnd,&pSStack_40->super_Opnd,
                               this->m_func);
      AddInstr(this,(Instr *)regOpnd,regSlot_local);
      stackFuncPtrSym =
           (StackSym *)
           PropertySym::New((StackSym *)fieldSymOpnd->m_sym,instr._4_4_,0xffffffff,0xffffffff,
                            PropertyKindSlots,this->m_func);
      pSStack_40 = IR::SymOpnd::New((Sym *)stackFuncPtrSym,TyVar,this->m_func);
      if ((fieldRegSlot_local._2_2_ != StSlot) && (fieldRegSlot_local._2_2_ != StSlotChkUndecl))
      goto LAB_0064851c;
    }
    else {
      if (fieldRegSlot_local._2_2_ == StObjSlot) {
        fieldRegSlot_local._2_2_ = StSlot;
        goto LAB_006483e2;
      }
      if (fieldRegSlot_local._2_2_ == StObjSlotChkUndecl) {
        fieldRegSlot_local._2_2_ = StSlotChkUndecl;
        goto LAB_006483e2;
      }
      if (fieldRegSlot_local._2_2_ == NewInnerScFunc) {
LAB_00647fd8:
        fieldRegSlot_local._2_2_ = NewScFunc;
LAB_00647fe6:
        pIVar9 = IR::IntConstOpnd::New((long)(int)instr._4_4_,TyInt32,this->m_func,true);
        pRVar7 = BuildSrcOpnd(this,slotId_local,TyVar);
        fieldSymOpnd = (SymOpnd *)BuildDstOpnd(this,local_20,TyVar,false,false);
        if (pSStack_58 == (StackSym *)0x0) {
          regOpnd = (RegOpnd *)
                    IR::Instr::New(fieldRegSlot_local._2_2_,(Opnd *)fieldSymOpnd,&pIVar9->super_Opnd
                                   ,&pRVar7->super_Opnd,this->m_func);
        }
        else {
          pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
          pRVar10 = IR::RegOpnd::New(pSStack_58,TyVar,this->m_func);
          regOpnd = (RegOpnd *)
                    IR::Instr::New(NewScFuncData,&pRVar8->super_Opnd,&pRVar7->super_Opnd,
                                   &pRVar10->super_Opnd,this->m_func);
          AddInstr(this,(Instr *)regOpnd,regSlot_local);
          regOpnd = (RegOpnd *)
                    IR::Instr::New(fieldRegSlot_local._2_2_,&fieldSymOpnd->super_Opnd,
                                   &pIVar9->super_Opnd,&pRVar8->super_Opnd,this->m_func);
        }
        if (((ulong)fieldSymOpnd->m_sym[1]._vptr_Sym & 1) != 0) {
          *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym =
               *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym & 0xfffffffb | 4;
          *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym =
               *(uint *)&fieldSymOpnd->m_sym[1]._vptr_Sym & 0xfffffffd | 2;
        }
        AddInstr(this,(Instr *)regOpnd,regSlot_local);
        return;
      }
      if (fieldRegSlot_local._2_2_ == NewInnerScGenFunc) {
        fieldRegSlot_local._2_2_ = NewScGenFunc;
        goto LAB_00647fe6;
      }
      if (fieldRegSlot_local._2_2_ == NewInnerStackScFunc) {
        pSStack_58 = EnsureStackFuncPtrSym(this);
        goto LAB_00647fd8;
      }
      if (fieldRegSlot_local._2_2_ == NewScGenFuncHomeObj) goto LAB_00648173;
      if (fieldRegSlot_local._2_2_ == StPropIdArrFromVar) {
        pRVar7 = BuildSrcOpnd(this,slotId_local,TyVar);
        pRVar8 = BuildSrcOpnd(this,local_20,TyVar);
        pIVar9 = IR::IntConstOpnd::New((long)(int)instr._4_4_,TyInt32,this->m_func,false);
        pRVar10 = IR::RegOpnd::New(TyVar,this->m_func);
        regOpnd = (RegOpnd *)
                  IR::Instr::New(ExtendArg_A,&pRVar10->super_Opnd,&pRVar8->super_Opnd,this->m_func);
        AddInstr(this,(Instr *)regOpnd,regSlot_local);
        regSlot_local = 0xffffffff;
        pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
        pOVar11 = IR::Instr::GetDst((Instr *)regOpnd);
        regOpnd = (RegOpnd *)
                  IR::Instr::New(ExtendArg_A,&pRVar8->super_Opnd,&pIVar9->super_Opnd,pOVar11,
                                 this->m_func);
        AddInstr(this,(Instr *)regOpnd,regSlot_local);
        pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
        pOVar11 = IR::Instr::GetDst((Instr *)regOpnd);
        regOpnd = (RegOpnd *)
                  IR::Instr::New(ExtendArg_A,&pRVar8->super_Opnd,&pRVar7->super_Opnd,pOVar11,
                                 this->m_func);
        AddInstr(this,(Instr *)regOpnd,regSlot_local);
        pOVar11 = IR::Instr::GetDst((Instr *)regOpnd);
        regOpnd = (RegOpnd *)IR::Instr::New(fieldRegSlot_local._2_2_,this->m_func);
        IR::Instr::SetSrc1((Instr *)regOpnd,pOVar11);
        goto LAB_0064887a;
      }
      if (fieldRegSlot_local._2_2_ == LdSlotArr) {
        fieldSym._7_1_ = PropertyKindSlotArray;
        goto LAB_006484ed;
      }
      if (1 < (ushort)(fieldRegSlot_local._2_2_ - StSlot)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xe17,"((0))","Unknown ElementSlot opcode");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
      pSStack_40 = BuildFieldOpnd(this,fieldRegSlot_local._2_2_,slotId_local,instr._4_4_,0xffffffff,
                                  PropertyKindSlots,0xffffffff);
    }
    fieldSymOpnd = (SymOpnd *)BuildSrcOpnd(this,local_20,TyVar);
    regOpnd = (RegOpnd *)
              IR::Instr::New(fieldRegSlot_local._2_2_,&pSStack_40->super_Opnd,(Opnd *)fieldSymOpnd,
                             this->m_func);
    if (fieldRegSlot_local._2_2_ == StSlotChkUndecl) {
      IR::Instr::SetSrc2((Instr *)regOpnd,&pSStack_40->super_Opnd);
    }
  }
LAB_0064887a:
  AddInstr(this,(Instr *)regOpnd,regSlot_local);
  if (((functionBodySlotOpnd._7_1_ & 1) != 0) && (bVar3 = DoBailOnNoProfile(this), bVar3)) {
    InsertBailOnNoProfile(this,(Instr *)regOpnd);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementSlot(Js::OpCode newOpcode, uint32 offset, Js::RegSlot fieldRegSlot, Js::RegSlot regSlot,
    int32 slotId, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IR::RegOpnd * regOpnd;

    IR::SymOpnd *   fieldSymOpnd;
    PropertyKind    propertyKind = PropertyKindSlots;
    PropertySym *   fieldSym;
    StackSym *      stackFuncPtrSym = nullptr;
    bool isLdSlotThatWasNotProfiled = false;

    switch (newOpcode)
    {
    case Js::OpCode::NewInnerStackScFunc:
        stackFuncPtrSym = this->EnsureStackFuncPtrSym();
        // fall through
    case Js::OpCode::NewInnerScFunc:
        newOpcode = Js::OpCode::NewScFunc;
        goto NewScFuncCommon;

    case Js::OpCode::NewInnerScGenFunc:
        newOpcode = Js::OpCode::NewScGenFunc;
NewScFuncCommon:
    {
        IR::Opnd * functionBodySlotOpnd = IR::IntConstOpnd::New(slotId, TyInt32, m_func, true);
        IR::Opnd * environmentOpnd = this->BuildSrcOpnd(fieldRegSlot);
        regOpnd = this->BuildDstOpnd(regSlot);
        if (stackFuncPtrSym)
        {
             IR::RegOpnd * dataOpnd = IR::RegOpnd::New(TyVar, m_func);
             instr = IR::Instr::New(Js::OpCode::NewScFuncData, dataOpnd, environmentOpnd, IR::RegOpnd::New(stackFuncPtrSym, TyVar, m_func), m_func);
             this->AddInstr(instr, offset);

            instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, dataOpnd, m_func);
        }
        else
        {
            instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, environmentOpnd, m_func);
        }
        if (regOpnd->m_sym->m_isSingleDef)
        {
            regOpnd->m_sym->m_isSafeThis = true;
            regOpnd->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    case Js::OpCode::NewScFuncHomeObj:
    case Js::OpCode::NewScGenFuncHomeObj:
    {
        Js::FunctionInfoPtrPtr infoRef = m_func->GetJITFunctionBody()->GetNestedFuncRef(slotId);
        IR::AddrOpnd * functionBodySlotOpnd = IR::AddrOpnd::New((Js::Var)infoRef, IR::AddrOpndKindDynamicMisc, m_func);
        IR::Opnd * environmentOpnd = GetEnvironmentOperand(offset);
        IR::Opnd * homeObjOpnd = this->BuildSrcOpnd(fieldRegSlot);
        regOpnd = this->BuildDstOpnd(regSlot);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), homeObjOpnd, m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), functionBodySlotOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), environmentOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(newOpcode, regOpnd, instr->GetDst(), m_func);

        if (regOpnd->m_sym->m_isSingleDef)
        {
            regOpnd->m_sym->m_isSafeThis = true;
            regOpnd->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    case Js::OpCode::LdObjSlot:
        newOpcode = Js::OpCode::LdSlot;
        goto ObjSlotCommon;

    case Js::OpCode::StObjSlot:
        newOpcode = Js::OpCode::StSlot;
        goto ObjSlotCommon;

    case Js::OpCode::StObjSlotChkUndecl:
        newOpcode = Js::OpCode::StSlotChkUndecl;

ObjSlotCommon:
        regOpnd = IR::RegOpnd::New(TyVar, m_func);
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var), (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
        instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldSymOpnd, m_func);
        this->AddInstr(instr, offset);

        fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
        fieldSymOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

        if (newOpcode == Js::OpCode::StSlot || newOpcode == Js::OpCode::StSlotChkUndecl)
        {
            goto StSlotCommon;
        }
        goto LdSlotCommon;

    case Js::OpCode::LdSlotArr:
        propertyKind = PropertyKindSlotArray;
    case Js::OpCode::LdSlot:
        // Load
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, slotId, (Js::PropertyIdIndexType)-1, propertyKind);

LdSlotCommon:
        regOpnd = this->BuildDstOpnd(regSlot);

        instr = nullptr;
        if (profileId != Js::Constants::NoProfileId)
        {
            instr = this->BuildProfiledSlotLoad(newOpcode, regOpnd, fieldSymOpnd, profileId, &isLdSlotThatWasNotProfiled);
        }
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        }
        break;

    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
        // Store
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, slotId, (Js::PropertyIdIndexType)-1, propertyKind);

StSlotCommon:
        regOpnd = this->BuildSrcOpnd(regSlot);

        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
        if (newOpcode == Js::OpCode::StSlotChkUndecl)
        {
            // ChkUndecl includes an implicit read of the destination. Communicate the liveness by using the destination in src2.
            instr->SetSrc2(fieldSymOpnd);
        }
        break;

    case Js::OpCode::StPropIdArrFromVar:
    {
        IR::RegOpnd *   src0Opnd = this->BuildSrcOpnd(fieldRegSlot);
        IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(regSlot);
        IntConstType    value = slotId;
        IR::IntConstOpnd * valOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, m_func);
        this->AddInstr(instr, offset);
        offset = Js::Constants::NoByteCodeOffset;

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), valOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src0Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        IR::Opnd * firstArg = instr->GetDst();
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(firstArg);
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementSlot opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);

    if(isLdSlotThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}